

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O1

void __thiscall
qclab::qgates::RotationY<std::complex<double>_>::RotationY
          (RotationY<std::complex<double>_> *this,int qubit,rotation_type *rot,bool fixed)

{
  double dVar1;
  
  (this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_0013a6b8;
  (this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.qubit_ =
       qubit;
  if (-1 < qubit) {
    (this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
    field_0xc = fixed;
    (this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_0013a9f8;
    dVar1 = (rot->angle_).sin_;
    (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_ = (rot->angle_).cos_;
    (this->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_ = dVar1;
    (this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_0013aa80;
    return;
  }
  __assert_fail("qubit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QGate1.hpp"
                ,0x21,
                "qclab::qgates::QGate1<std::complex<double>>::QGate1(const int) [T = std::complex<double>]"
               );
}

Assistant:

QGate1( const int qubit )
        : qubit_( qubit )
        {
          assert( qubit >= 0 ) ;
        }